

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O0

nanoseconds __thiscall toml::local_time::operator_cast_to_duration(local_time *this)

{
  type tVar1;
  uchar *in_RDI;
  duration<long,std::ratio<3600l,1l>> local_60 [8];
  duration<long,std::ratio<60l,1l>> local_58 [8];
  duration<long,_std::ratio<3600L,_1L>_> *in_stack_ffffffffffffffb0;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  duration<long,std::ratio<1l,1000000l>> local_40 [8];
  duration<long,std::ratio<1l,1000000000l>> local_38 [8];
  rep local_30;
  rep local_28;
  rep local_20;
  rep local_18;
  
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<unsigned_short,void>
            (local_38,(unsigned_short *)(in_RDI + 8));
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_short,void>
            (local_40,(unsigned_short *)(in_RDI + 6));
  local_30 = (rep)std::chrono::operator+
                            (in_stack_ffffffffffffffb8,
                             (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffffb0)
  ;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_short,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb8,
             (unsigned_short *)(in_RDI + 4));
  local_28 = (rep)std::chrono::operator+
                            (in_stack_ffffffffffffffb8,
                             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffb0);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_char,void>
            ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffb0,in_RDI + 2);
  local_20 = (rep)std::chrono::operator+
                            (in_stack_ffffffffffffffb8,
                             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffb0);
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<unsigned_char,void>(local_58,in_RDI + 1);
  local_18 = (rep)std::chrono::operator+
                            (in_stack_ffffffffffffffb8,
                             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_ffffffffffffffb0);
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<unsigned_char,void>(local_60,in_RDI);
  tVar1 = std::chrono::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return (nanoseconds)tVar1.__r;
}

Assistant:

TOML11_INLINE local_time::operator std::chrono::nanoseconds() const
{
    return std::chrono::nanoseconds (this->nanosecond)  +
           std::chrono::microseconds(this->microsecond) +
           std::chrono::milliseconds(this->millisecond) +
           std::chrono::seconds(this->second) +
           std::chrono::minutes(this->minute) +
           std::chrono::hours(this->hour);
}